

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodings.h
# Opt level: O1

bool rapidjson::Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
     Transcode<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
               (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
               StackStream<char> *os)

{
  MemoryStream *pMVar1;
  char *pcVar2;
  char cVar3;
  
  pMVar1 = is->is_;
  pcVar2 = pMVar1->src_;
  if (pcVar2 == pMVar1->end_) {
    cVar3 = '\0';
  }
  else {
    pMVar1->src_ = pcVar2 + 1;
    cVar3 = *pcVar2;
  }
  pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
  *pcVar2 = cVar3;
  os->length_ = os->length_ + 1;
  return true;
}

Assistant:

static RAPIDJSON_FORCEINLINE bool Transcode(InputStream& is, OutputStream& os) {
        os.Put(is.Take());  // Just copy one code unit. This semantic is different from primary template class.
        return true;
    }